

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O2

int parse_key(char *ascii,uint8_t *key)

{
  short sVar1;
  long lVar2;
  long lVar3;
  char byte [3];
  
  lVar3 = 0;
  do {
    if (lVar3 == 0x20) {
      return -(uint)(ascii[0x40] != '\0');
    }
    sVar1 = *(short *)(ascii + lVar3 * 2);
    lVar2 = strtol(byte,(char **)0x0,0x10);
    key[lVar3] = (uint8_t)lVar2;
    lVar3 = lVar3 + 1;
  } while (((uint8_t)lVar2 != '\0') || (sVar1 == 0x3030));
  return -1;
}

Assistant:

int parse_key(const char *ascii, uint8_t key[0x20]) {
  int i;
  for (i = 0; i < 0x20; i++) {
    char byte[3];
    memcpy(byte, &ascii[2*i], 2);
    byte[2] = '\0';
    key[i] = strtol(byte, NULL, 16);
    if (key[i] == 0 && !(byte[0] == '0' && byte[1] == '0')) {
      return -1;
    }
  }
  if (ascii[2*i] != '\0') {
    return -1;
  } else {
    return 0;
  }
}